

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O2

ssize_t add_from_client(void *reader_ctx,uchar *buf,size_t buflen,CURLcode *err)

{
  CURLcode CVar1;
  _Bool eos;
  size_t nread;
  
  CVar1 = Curl_client_read((Curl_easy *)reader_ctx,(char *)buf,buflen,&nread,&eos);
  *err = CVar1;
  if (CVar1 == CURLE_OK) {
    if (eos == true) {
      *(byte *)((long)reader_ctx + 0x199) = *(byte *)((long)reader_ctx + 0x199) | 0x20;
    }
  }
  else {
    nread = 0xffffffffffffffff;
  }
  return nread;
}

Assistant:

static ssize_t add_from_client(void *reader_ctx,
                               unsigned char *buf, size_t buflen,
                               CURLcode *err)
{
  struct Curl_easy *data = reader_ctx;
  size_t nread;
  bool eos;

  *err = Curl_client_read(data, (char *)buf, buflen, &nread, &eos);
  if(*err)
    return -1;
  if(eos)
    data->req.eos_read = TRUE;
  return (ssize_t)nread;
}